

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O1

MPP_RET __thiscall MppDevServer::detach(MppDevServer *this,MppDevMppService *ctx)

{
  undefined8 *p;
  pthread_mutex_t *__mutex;
  long lVar1;
  long *plVar2;
  pthread_mutex_t *__mutex_00;
  MppDevBatServ *pMVar3;
  MPP_RET MVar4;
  
  if (this->mInited == 0) {
    _mpp_log_l(2,"mpp_server","mpp server failed for %s\n",(char *)0x0,this->mServerError);
    MVar4 = MPP_NOK;
  }
  else {
    pMVar3 = bat_server_get(this,ctx->client_type);
    p = (undefined8 *)ctx->serv_ctx;
    if (pMVar3 == (MppDevBatServ *)0x0) {
      _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"server","detach",0x35a
                );
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00174c27;
    }
    __mutex = (pthread_mutex_t *)pMVar3->lock;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    if (ctx->serv_ctx != (void *)0x0) {
      ctx->server = ctx->client;
      ctx->serv_ctx = (void *)0x0;
      ctx->batch_io = 0;
      if (p == (undefined8 *)0x0) {
        _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"session","detach",
                   0x365);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00174c27;
      }
      if (*(int *)(p + 9) != ctx->client) {
        _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "session->client == ctx->client","detach",0x366);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00174c27;
      }
      if (*(int *)((long)p + 0x4c) != *(int *)(p + 10)) {
        _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "session->task_wait == session->task_done","detach",0x367);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00174c27;
      }
      if ((undefined8 *)p[3] != p + 3) {
        _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "list_empty(&session->list_wait)","detach",0x368);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00174c27:
          abort();
        }
      }
      lVar1 = p[1];
      plVar2 = (long *)p[2];
      *(long **)(lVar1 + 8) = plVar2;
      *plVar2 = lVar1;
      p[1] = p + 1;
      p[2] = p + 1;
      __mutex_00 = (pthread_mutex_t *)*p;
      if (__mutex_00 != (pthread_mutex_t *)0x0) {
        pthread_cond_destroy((pthread_cond_t *)(__mutex_00 + 1));
        pthread_mutex_destroy(__mutex_00);
        operator_delete(__mutex_00,0x58);
        *p = 0;
      }
      mpp_mem_pool_put_f("detach",this->mSessionPool,p);
      pMVar3->batch_max_count = pMVar3->batch_max_count + 1;
      pMVar3->session_count = pMVar3->session_count + 1;
    }
    MVar4 = MPP_OK;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
      MVar4 = MPP_OK;
    }
  }
  return MVar4;
}

Assistant:

MPP_RET MppDevServer::detach(MppDevMppService *ctx)
{
    if (!mInited) {
        mpp_err("mpp server failed for %s\n", mServerError);
        return MPP_NOK;
    }

    MppClientType client_type = (MppClientType)ctx->client_type;

    MppDevBatServ *server = bat_server_get(client_type);
    MppDevSession *session = (MppDevSession *)ctx->serv_ctx;

    mpp_assert(server);

    AutoMutex auto_lock(server->lock);
    if (NULL == ctx->serv_ctx)
        return MPP_OK;

    ctx->server = ctx->client;
    ctx->serv_ctx = NULL;
    ctx->batch_io = 0;

    mpp_assert(server);
    mpp_assert(session);
    mpp_assert(session->client == ctx->client);
    mpp_assert(session->task_wait == session->task_done);
    mpp_assert(list_empty(&session->list_wait));

    list_del_init(&session->list_server);

    if (session->cond) {
        delete session->cond;
        session->cond = NULL;
    }

    mpp_mem_pool_put(mSessionPool, session);
    server->batch_max_count++;
    server->session_count++;

    return MPP_OK;
}